

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fill<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
                 (char *target,FixedArray<char,_1UL> *first,ArrayPtr<const_char> *rest,
                 FixedArray<char,_1UL> *rest_1)

{
  char *pcVar1;
  ArrayPtr<const_char> *first_00;
  FixedArray<char,_1UL> *rest_00;
  char *end;
  char *i;
  FixedArray<char,_1UL> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  FixedArray<char,_1UL> *first_local;
  char *target_local;
  
  end = FixedArray<char,_1UL>::begin(first);
  pcVar1 = FixedArray<char,_1UL>::end(first);
  first_local = (FixedArray<char,_1UL> *)target;
  while (end != pcVar1) {
    first_local->content[0] = *end;
    end = end + 1;
    first_local = first_local + 1;
  }
  first_00 = fwd<kj::ArrayPtr<char_const>>(rest);
  rest_00 = fwd<kj::FixedArray<char,1ul>>(rest_1);
  pcVar1 = fill<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
                     (first_local->content,first_00,rest_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}